

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepper.h
# Opt level: O1

void __thiscall chrono::ChTimestepperHeun::~ChTimestepperHeun(ChTimestepperHeun *this)

{
  double *pdVar1;
  
  (this->super_ChTimestepperIorder).super_ChTimestepper._vptr_ChTimestepper =
       (_func_int **)&PTR__ChTimestepperHeun_00b6b308;
  pdVar1 = (this->Dydt2).super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (pdVar1 != (double *)0x0) {
    free((void *)pdVar1[-1]);
  }
  pdVar1 = (this->Dydt1).super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (pdVar1 != (double *)0x0) {
    free((void *)pdVar1[-1]);
  }
  pdVar1 = (this->y_new).super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (pdVar1 != (double *)0x0) {
    free((void *)pdVar1[-1]);
  }
  ChTimestepperIorder::~ChTimestepperIorder(&this->super_ChTimestepperIorder);
  operator_delete(this,0xb0);
  return;
}

Assistant:

class ChApi ChTimestepperHeun : public ChTimestepperIorder {
  protected:
    ChState y_new;
    ChStateDelta Dydt1;
    ChStateDelta Dydt2;

  public:
    /// Constructors (default empty)
    ChTimestepperHeun(ChIntegrable* intgr = nullptr) : ChTimestepperIorder(intgr) {}

    virtual Type GetType() const override { return Type::HEUN; }

    /// Performs an integration timestep
    virtual void Advance(const double dt  ///< timestep to advance
                         ) override;
}